

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void * Curl_hash_pick(Curl_hash *h,void *key,size_t key_len)

{
  Curl_llist *pCVar1;
  void *in_RAX;
  size_t sVar2;
  Curl_llist_node *n;
  void *pvVar3;
  void *local_38;
  
  pCVar1 = h->table;
  if (pCVar1 != (Curl_llist *)0x0) {
    sVar2 = (*h->hash_func)(key,key_len,h->slots);
    for (n = Curl_llist_head(pCVar1 + sVar2); local_38 = in_RAX, n != (Curl_llist_node *)0x0;
        n = Curl_node_next(n)) {
      pvVar3 = Curl_node_elem(n);
      sVar2 = (*h->comp_func)((void *)((long)pvVar3 + 0x38),*(size_t *)((long)pvVar3 + 0x30),key,
                              key_len);
      if (sVar2 != 0) {
        local_38 = *(void **)((long)pvVar3 + 0x20);
        break;
      }
    }
    if (n != (Curl_llist_node *)0x0) {
      return local_38;
    }
  }
  return (void *)0x0;
}

Assistant:

void *
Curl_hash_pick(struct Curl_hash *h, void *key, size_t key_len)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    struct Curl_llist_node *le;
    struct Curl_llist *l;
    DEBUGASSERT(h->slots);
    l = FETCH_LIST(h, key, key_len);
    for(le = Curl_llist_head(l); le; le = Curl_node_next(le)) {
      struct Curl_hash_element *he = Curl_node_elem(le);
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        return he->ptr;
      }
    }
  }

  return NULL;
}